

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

void reward_untrap(trap *ttmp,monst *mtmp)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  
  if ((char)ttmp < '\0') {
    return;
  }
  uVar2 = mt_random();
  uVar2 = uVar2 % 10;
  lVar7 = (long)u.uluck;
  lVar5 = (long)u.moreluck;
  if (((int)(lVar5 + lVar7) == 0) ||
     (uVar3 = mt_random(), SUB168(ZEXT416(uVar3) % SEXT816(0x32 - (lVar5 + lVar7)),0) == 0)) {
LAB_0026ec96:
    if (7 < uVar2) goto LAB_0026ece4;
  }
  else {
    iVar4 = (int)u.moreluck + (int)u.uluck;
    if (-6 < iVar4) {
      sVar1 = (short)((uint)(iVar4 * 0x5556) >> 0x10);
      iVar4 = (int)(short)(sVar1 - (sVar1 >> 0xf));
    }
    uVar2 = uVar2 - iVar4;
    if (-1 < (int)uVar2) {
      if (9 < uVar2) goto LAB_0026ece4;
      goto LAB_0026ec96;
    }
  }
  if (((((*(uint *)&mtmp->field_0x60 & 0x480000) == 0) && (mtmp->mfrozen == '\0')) &&
      ((mtmp->data->mflags1 & 0x10000) == 0)) && (mtmp->data->mlet != '5')) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 | 0x400000;
    set_malign(mtmp);
    pcVar6 = Monnam(mtmp);
    pline("%s is grateful.",pcVar6);
  }
LAB_0026ece4:
  uVar2 = mt_random();
  if (uVar2 * -0x55555555 < 0x55555556) {
    uVar2 = mt_random();
    uVar2 = uVar2 & 7;
    lVar7 = (long)u.uluck;
    lVar5 = (long)u.moreluck;
    if (((int)(lVar5 + lVar7) != 0) &&
       (uVar3 = mt_random(), SUB168(ZEXT416(uVar3) % SEXT816(0x32 - (lVar5 + lVar7)),0) != 0)) {
      iVar4 = (int)u.moreluck + (int)u.uluck;
      if (-6 < iVar4) {
        sVar1 = (short)((uint)(iVar4 * 0x5556) >> 0x10);
        iVar4 = (int)(short)(sVar1 - (sVar1 >> 0xf));
      }
      uVar2 = uVar2 - iVar4;
      if ((int)uVar2 < 0) {
        uVar2 = 0;
      }
      else if (6 < uVar2) {
        uVar2 = 7;
      }
    }
    if ((uVar2 == 0) && (u.ualign.type == '\x01')) {
      adjalign(1);
      pline("You feel that you did the right thing.");
      return;
    }
  }
  return;
}

Assistant:

static void reward_untrap(struct trap *ttmp, struct monst *mtmp)
{
	if (!ttmp->madeby_u) {
	    if (rnl(10) < 8 && !mtmp->mpeaceful &&
		    !mtmp->msleeping && !mtmp->mfrozen &&
		    !mindless(mtmp->data) &&
		    mtmp->data->mlet != S_HUMAN) {
		mtmp->mpeaceful = 1;
		set_malign(mtmp);	/* reset alignment */
		pline("%s is grateful.", Monnam(mtmp));
	    }
	    /* Helping someone out of a trap is a nice thing to do,
	     * A lawful may be rewarded, but not too often.  */
	    if (!rn2(3) && !rnl(8) && u.ualign.type == A_LAWFUL) {
		adjalign(1);
		pline("You feel that you did the right thing.");
	    }
	}
}